

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O1

char * google::protobuf::internal::FieldParser<google::protobuf::internal::UnknownFieldParserHelper>
                 (uint64_t tag,UnknownFieldParserHelper *field_parser,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  char *pcVar2;
  ulong uVar3;
  uint32_t num;
  pair<const_char_*,_unsigned_long> pVar4;
  LogMessage LStack_28;
  
  num = (uint32_t)(tag >> 3);
  if (num == 0) {
    return (char *)0x0;
  }
  uVar3 = (ulong)((uint)tag & 7);
  switch(uVar3) {
  case 0:
    do {
      uVar3 = uVar3 + 1;
    } while (uVar3 != 10);
    bVar1 = *ptr;
    if ((long)(char)bVar1 < 0) {
      pVar4 = VarintParseSlow64(ptr,(uint)bVar1);
    }
    else {
      pVar4.second = (long)(char)bVar1;
      pVar4.first = ptr + 1;
    }
    if (pVar4.first == (char *)0x0) {
      return (char *)0x0;
    }
    UnknownFieldSet::AddVarint(field_parser->unknown_,num,pVar4.second);
    return pVar4.first;
  case 1:
    UnknownFieldSet::AddFixed64(field_parser->unknown_,num,*(uint64_t *)ptr);
    return ptr + 8;
  case 2:
    pcVar2 = UnknownFieldParserHelper::ParseLengthDelimited(field_parser,num,ptr,ctx);
    break;
  case 3:
    pcVar2 = UnknownFieldParserHelper::ParseGroup(field_parser,num,ptr,ctx);
    break;
  case 4:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&LStack_28,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
               ,0x55a);
    absl::lts_20250127::log_internal::LogMessage::operator<<
              (&LStack_28,(char (*) [13])"Can\'t happen");
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&LStack_28);
  case 5:
    UnknownFieldSet::AddFixed32(field_parser->unknown_,num,*(uint32_t *)ptr);
    return ptr + 4;
  default:
    goto LAB_004964e9;
  }
  if (pcVar2 != (char *)0x0) {
    return pcVar2;
  }
LAB_004964e9:
  return (char *)0x0;
}

Assistant:

[[nodiscard]] const char* FieldParser(uint64_t tag, T& field_parser,
                                      const char* ptr, ParseContext* ctx) {
  uint32_t number = tag >> 3;
  GOOGLE_PROTOBUF_PARSER_ASSERT(number != 0);
  using WireType = internal::WireFormatLite::WireType;
  switch (tag & 7) {
    case WireType::WIRETYPE_VARINT: {
      uint64_t value;
      ptr = VarintParse(ptr, &value);
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
      field_parser.AddVarint(number, value);
      break;
    }
    case WireType::WIRETYPE_FIXED64: {
      uint64_t value = UnalignedLoad<uint64_t>(ptr);
      ptr += 8;
      field_parser.AddFixed64(number, value);
      break;
    }
    case WireType::WIRETYPE_LENGTH_DELIMITED: {
      ptr = field_parser.ParseLengthDelimited(number, ptr, ctx);
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
      break;
    }
    case WireType::WIRETYPE_START_GROUP: {
      ptr = field_parser.ParseGroup(number, ptr, ctx);
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
      break;
    }
    case WireType::WIRETYPE_END_GROUP: {
      ABSL_LOG(FATAL) << "Can't happen";
      break;
    }
    case WireType::WIRETYPE_FIXED32: {
      uint32_t value = UnalignedLoad<uint32_t>(ptr);
      ptr += 4;
      field_parser.AddFixed32(number, value);
      break;
    }
    default:
      return nullptr;
  }
  return ptr;
}